

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

int Abc_FlowRetime_VerifyPathLatencies_rec(Abc_Obj_t *pObj,int markD)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pObj_00;
  bool local_41;
  uint local_38;
  int markC;
  int fCare;
  Abc_Obj_t *pNext;
  int local_20;
  int j;
  int i;
  int markD_local;
  Abc_Obj_t *pObj_local;
  
  bVar1 = false;
  local_38 = *(uint *)&pObj->field_0x14 >> 6 & 1;
  if ((*(uint *)&pObj->field_0x14 >> 5 & 1) == 0) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffdf | 0x20;
    iVar2 = Abc_ObjIsLatch(pObj);
    if (iVar2 != 0) {
      local_38 = 1;
    }
    if (((pManMR->fIsForward == 0) && (iVar2 = Abc_ObjIsPo(pObj), iVar2 == 0)) &&
       (iVar2 = Abc_ObjFanoutNum(pObj), iVar2 == 0)) {
      return -1;
    }
    for (local_20 = 0; iVar2 = Abc_ObjFanoutNum(pObj), local_20 < iVar2; local_20 = local_20 + 1) {
      pObj_00 = Abc_ObjFanout(pObj,local_20);
      iVar2 = Abc_ObjIsBo(pObj_00);
      if ((iVar2 == 0) && ((pManMR->fIsForward == 0 || (iVar2 = Abc_ObjIsPo(pObj_00), iVar2 == 0))))
      {
        if ((pManMR->fIsForward == 0) && (iVar2 = Abc_ObjIsPo(pObj_00), iVar2 != 0)) {
          if ((markD != 0) || (iVar2 = Abc_ObjIsLatch(pObj), iVar2 != 0)) {
            printf("\nERROR: extra-latch path to outputs\n");
            print_node(pObj_00);
            printf("\n");
            fPathError = 1;
          }
        }
        else {
          local_41 = true;
          if (markD == 0) {
            iVar2 = Abc_ObjIsLatch(pObj);
            local_41 = iVar2 != 0;
          }
          uVar3 = Abc_FlowRetime_VerifyPathLatencies_rec(pObj_00,(uint)local_41);
          if (-1 < (int)uVar3) {
            local_38 = uVar3 | local_38;
            bVar1 = true;
          }
        }
      }
      else if ((markD == 0) && (iVar2 = Abc_ObjIsLatch(pObj), iVar2 == 0)) {
        printf("\nERROR: no-latch path (end)\n");
        print_node(pObj_00);
        printf("\n");
        fPathError = 1;
      }
      if (fPathError != 0) {
        print_node(pObj);
        printf("\n");
        return 0;
      }
    }
  }
  if (bVar1) {
    if ((local_38 != 0) && (markD != 0)) {
      printf("\nERROR: mult-latch path\n");
      print_node(pObj);
      printf("\n");
      fPathError = 1;
    }
    if ((local_38 == 0) && (markD == 0)) {
      printf("\nERROR: no-latch path (inter)\n");
      print_node(pObj);
      printf("\n");
      fPathError = 1;
    }
    pObj_local._4_4_ = local_38 & 1;
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | pObj_local._4_4_ << 6;
  }
  else {
    pObj_local._4_4_ = 0xffffffff;
  }
  return pObj_local._4_4_;
}

Assistant:

int
Abc_FlowRetime_VerifyPathLatencies_rec( Abc_Obj_t * pObj, int markD ) {
  int i, j;
  Abc_Obj_t *pNext;
  int fCare = 0;
  int markC = pObj->fMarkC;

  if (!pObj->fMarkB) {
    pObj->fMarkB = 1; // visited
    
    if (Abc_ObjIsLatch(pObj))
      markC = 1;      // latch in output
    
    if (!pManMR->fIsForward && !Abc_ObjIsPo(pObj) && !Abc_ObjFanoutNum(pObj))
      return -1; // dangling non-PO outputs : don't care what happens
    
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      // reached end of cycle?
      if ( Abc_ObjIsBo(pNext) ||
           (pManMR->fIsForward && Abc_ObjIsPo(pNext)) ) {
        if (!markD && !Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: no-latch path (end)\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else if (!pManMR->fIsForward && Abc_ObjIsPo(pNext)) {
        if (markD || Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: extra-latch path to outputs\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else {
        j = Abc_FlowRetime_VerifyPathLatencies_rec( pNext, markD || Abc_ObjIsLatch(pObj) );
        if (j >= 0) {
          markC |= j;
          fCare = 1;
        }
      }

      if (fPathError) {
        print_node(pObj);
        printf("\n");
        return 0;
      }
    }
  }

  if (!fCare) return -1;

  if (markC && markD) {
    printf("\nERROR: mult-latch path\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }
  if (!markC && !markD) {
    printf("\nERROR: no-latch path (inter)\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }

  return (pObj->fMarkC = markC);
}